

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void start_pass_fdctmgr(j_compress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined8 uVar5;
  long *in_RDI;
  int col;
  int row;
  float *fdtbl;
  DCTELEM *dtbl;
  JQUANT_TBL *qtbl;
  jpeg_component_info *compptr;
  int i;
  int qtblno;
  int ci;
  my_fdct_ptr fdct;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  long in_stack_ffffffffffffffc0;
  long local_28;
  int local_1c;
  int local_14;
  
  lVar2 = in_RDI[0x3d];
  local_14 = 0;
  local_28 = in_RDI[0xb];
  for (; local_14 < *(int *)((long)in_RDI + 0x4c); local_14 = local_14 + 1) {
    iVar4 = *(int *)(local_28 + 0x10);
    if (((iVar4 < 0) || (3 < iVar4)) || (in_RDI[(long)iVar4 + 0xc] == 0)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x34;
      *(int *)(*in_RDI + 0x2c) = iVar4;
      (**(code **)*in_RDI)(in_RDI);
    }
    lVar3 = in_RDI[(long)iVar4 + 0xc];
    iVar1 = *(int *)((long)in_RDI + 0x114);
    if (iVar1 == 0) {
      if (*(long *)(lVar2 + 0x28 + (long)iVar4 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x200);
        *(undefined8 *)(lVar2 + 0x28 + (long)iVar4 * 8) = uVar5;
      }
      for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
        iVar4 = compute_reciprocal((UINT16)((ulong)in_stack_ffffffffffffffc0 >> 0x10),
                                   (DCTELEM *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if ((iVar4 == 0) && (*(code **)(lVar2 + 0x20) == jsimd_quantize)) {
          *(code **)(lVar2 + 0x20) = quantize;
        }
      }
    }
    else if (iVar1 == 1) {
      if (*(long *)(lVar2 + 0x28 + (long)iVar4 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x200);
        *(undefined8 *)(lVar2 + 0x28 + (long)iVar4 * 8) = uVar5;
      }
      for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
        iVar4 = compute_reciprocal((UINT16)((ulong)in_stack_ffffffffffffffc0 >> 0x10),
                                   (DCTELEM *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if ((iVar4 == 0) && (*(code **)(lVar2 + 0x20) == jsimd_quantize)) {
          *(code **)(lVar2 + 0x20) = quantize;
        }
      }
    }
    else if (iVar1 == 2) {
      if (*(long *)(lVar2 + 0x68 + (long)iVar4 * 8) == 0) {
        uVar5 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
        *(undefined8 *)(lVar2 + 0x68 + (long)iVar4 * 8) = uVar5;
      }
      in_stack_ffffffffffffffc0 = *(long *)(lVar2 + 0x68 + (long)iVar4 * 8);
      local_1c = 0;
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < 8;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < 8;
            in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
          *(float *)(in_stack_ffffffffffffffc0 + (long)local_1c * 4) =
               (float)(1.0 / ((double)*(ushort *)(lVar3 + (long)local_1c * 2) *
                              start_pass_fdctmgr::aanscalefactor[in_stack_ffffffffffffffbc] *
                              start_pass_fdctmgr::aanscalefactor[in_stack_ffffffffffffffb8] * 8.0));
          local_1c = local_1c + 1;
        }
      }
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x30;
      (**(code **)*in_RDI)(in_RDI);
    }
    local_28 = local_28 + 0x60;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_fdctmgr(j_compress_ptr cinfo)
{
  my_fdct_ptr fdct = (my_fdct_ptr)cinfo->fdct;
  int ci, qtblno, i;
  jpeg_component_info *compptr;
  JQUANT_TBL *qtbl;
  DCTELEM *dtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    qtblno = compptr->quant_tbl_no;
    /* Make sure specified quantization table is present */
    if (qtblno < 0 || qtblno >= NUM_QUANT_TBLS ||
        cinfo->quant_tbl_ptrs[qtblno] == NULL)
      ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, qtblno);
    qtbl = cinfo->quant_tbl_ptrs[qtblno];
    /* Compute divisors for this quant table */
    /* We may do this more than once for same table, but it's not a big deal */
    switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
    case JDCT_ISLOW:
      /* For LL&M IDCT method, divisors are equal to raw quantization
       * coefficients multiplied by 8 (to counteract scaling).
       */
      if (fdct->divisors[qtblno] == NULL) {
        fdct->divisors[qtblno] = (DCTELEM *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      (DCTSIZE2 * 4) * sizeof(DCTELEM));
      }
      dtbl = fdct->divisors[qtblno];
      for (i = 0; i < DCTSIZE2; i++) {
#if BITS_IN_JSAMPLE == 8
        if (!compute_reciprocal(qtbl->quantval[i] << 3, &dtbl[i]) &&
            fdct->quantize == jsimd_quantize)
          fdct->quantize = quantize;
#else
        dtbl[i] = ((DCTELEM)qtbl->quantval[i]) << 3;
#endif
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
        /* For AA&N IDCT method, divisors are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         * We apply a further scale factor of 8.
         */
#define CONST_BITS  14
        static const INT16 aanscales[DCTSIZE2] = {
          /* precomputed values scaled up by 14 bits */
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
          21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
          19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
           8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
           4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
        };
        SHIFT_TEMPS

        if (fdct->divisors[qtblno] == NULL) {
          fdct->divisors[qtblno] = (DCTELEM *)
            (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                        (DCTSIZE2 * 4) * sizeof(DCTELEM));
        }
        dtbl = fdct->divisors[qtblno];
        for (i = 0; i < DCTSIZE2; i++) {
#if BITS_IN_JSAMPLE == 8
          if (!compute_reciprocal(
                DESCALE(MULTIPLY16V16((JLONG)qtbl->quantval[i],
                                      (JLONG)aanscales[i]),
                        CONST_BITS - 3), &dtbl[i]) &&
              fdct->quantize == jsimd_quantize)
            fdct->quantize = quantize;
#else
          dtbl[i] = (DCTELEM)
            DESCALE(MULTIPLY16V16((JLONG)qtbl->quantval[i],
                                  (JLONG)aanscales[i]),
                    CONST_BITS - 3);
#endif
        }
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
        /* For float AA&N IDCT method, divisors are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         * We apply a further scale factor of 8.
         * What's actually stored is 1/divisor so that the inner loop can
         * use a multiplication rather than a division.
         */
        FAST_FLOAT *fdtbl;
        int row, col;
        static const double aanscalefactor[DCTSIZE] = {
          1.0, 1.387039845, 1.306562965, 1.175875602,
          1.0, 0.785694958, 0.541196100, 0.275899379
        };

        if (fdct->float_divisors[qtblno] == NULL) {
          fdct->float_divisors[qtblno] = (FAST_FLOAT *)
            (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                        DCTSIZE2 * sizeof(FAST_FLOAT));
        }
        fdtbl = fdct->float_divisors[qtblno];
        i = 0;
        for (row = 0; row < DCTSIZE; row++) {
          for (col = 0; col < DCTSIZE; col++) {
            fdtbl[i] = (FAST_FLOAT)
              (1.0 / (((double)qtbl->quantval[i] *
                       aanscalefactor[row] * aanscalefactor[col] * 8.0)));
            i++;
          }
        }
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}